

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O2

void __thiscall Channel::update(Channel *this)

{
  EventLoop *this_00;
  __shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this_00 = this->loop_;
  std::__shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Channel,void>
            (local_28,(__weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *)this);
  EventLoop::updateChannel(this_00,(ChannelPtr *)local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return;
}

Assistant:

void Channel::update() {
    loop_->updateChannel(shared_from_this());
}